

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::min_each<int>(Omega_h *this,Read<int> *a,Read<int> *b)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> local_120;
  undefined1 local_110 [8];
  type f;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  Write<int> c;
  Read<int> *b_local;
  Read<int> *a_local;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr = b;
  if ((int)(local_10 >> 2) == (int)(local_20 >> 2)) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"",&local_c9);
    Write<int>::Write((Write<int> *)local_a8,(LO)(local_30 >> 2),(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    Write<int>::Write((Write<int> *)local_110,(Write<int> *)local_a8);
    Read<int>::Read((Read<int> *)&f.c.shared_alloc_.direct_ptr,a);
    Read<int>::Read((Read<int> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    if (((ulong)local_a8 & 1) == 0) {
      local_40 = *(size_t *)local_a8;
    }
    else {
      local_40 = (ulong)local_a8 >> 3;
    }
    parallel_for<Omega_h::min_each<int>(Omega_h::Read<int>,Omega_h::Read<int>)::_lambda(int)_1_>
              ((LO)(local_40 >> 2),(type *)local_110,"min_each");
    Write<int>::Write(&local_120,(Write<int> *)local_a8);
    Read<int>::Read((Read<int> *)this,&local_120);
    Write<int>::~Write(&local_120);
    min_each<int>(Omega_h::Read<int>,Omega_h::Read<int>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)local_110);
    Write<int>::~Write((Write<int> *)local_a8);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x125);
}

Assistant:

Read<T> min_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = min2(a[i], b[i]); };
  parallel_for(c.size(), f, "min_each");
  return c;
}